

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKMoeller<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  Scene *pSVar3;
  Geometry *pGVar4;
  undefined1 auVar5 [32];
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 (*pauVar8) [16];
  int iVar9;
  undefined4 uVar10;
  AABBNodeMB4D *node1;
  ulong uVar11;
  long lVar12;
  RayHitK<8> *pRVar13;
  RayHitK<8> *pRVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  float *vertices;
  ulong uVar27;
  Scene *scene;
  ulong uVar28;
  ulong uVar29;
  vint4 bi_1;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar53;
  float fVar59;
  float fVar60;
  vint4 bi;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar61;
  undefined1 auVar57 [16];
  vint4 ai;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [64];
  uint uVar74;
  uint uVar75;
  uint uVar76;
  undefined1 auVar73 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [64];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 (*local_1390) [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  ulong local_1320;
  ulong local_1318;
  ulong local_1310;
  ulong local_1308;
  size_t local_1300;
  Scene *local_12f8;
  RayHitK<8> *local_12f0;
  RayHitK<8> *local_12e8;
  undefined8 *local_12e0;
  void *local_12d8;
  RTCRayQueryContext *local_12d0;
  RayHitK<8> *local_12c8;
  undefined1 (*local_12c0) [32];
  undefined4 local_12b8;
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  undefined1 local_12a0 [16];
  undefined1 local_1290 [16];
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1250 [16];
  float local_1240 [4];
  float local_1230 [4];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  undefined1 local_1170 [16];
  undefined1 local_1160 [16];
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [2] [16];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  ulong uVar14;
  undefined1 auVar52 [32];
  undefined1 auVar58 [32];
  
  local_1390 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar53 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1150._4_4_ = fVar53;
  local_1150._0_4_ = fVar53;
  local_1150._8_4_ = fVar53;
  local_1150._12_4_ = fVar53;
  auVar69 = ZEXT1664(local_1150);
  fVar59 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1160._4_4_ = fVar59;
  local_1160._0_4_ = fVar59;
  local_1160._8_4_ = fVar59;
  local_1160._12_4_ = fVar59;
  auVar72 = ZEXT1664(local_1160);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1170._4_4_ = fVar60;
  local_1170._0_4_ = fVar60;
  local_1170._8_4_ = fVar60;
  local_1170._12_4_ = fVar60;
  auVar73 = ZEXT1664(local_1170);
  fVar53 = fVar53 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar59 = fVar59 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar60 = fVar60 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1308 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1310 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1318 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1320 = local_1308 ^ 0x10;
  uVar18 = local_1310 ^ 0x10;
  uVar23 = local_1318 ^ 0x10;
  local_1140._8_4_ = 0x80000000;
  local_1140._0_8_ = 0x8000000080000000;
  local_1140._12_4_ = 0x80000000;
  iVar9 = (tray->tfar).field_0.i[k];
  auVar39 = ZEXT1664(CONCAT412(iVar9,CONCAT48(iVar9,CONCAT44(iVar9,iVar9))));
  local_1180._0_8_ = CONCAT44(fVar53,fVar53) ^ 0x8000000080000000;
  local_1180._8_4_ = -fVar53;
  local_1180._12_4_ = -fVar53;
  auVar79 = ZEXT1664(local_1180);
  local_1190._0_8_ = CONCAT44(fVar59,fVar59) ^ 0x8000000080000000;
  local_1190._8_4_ = -fVar59;
  local_1190._12_4_ = -fVar59;
  auVar81 = ZEXT1664(local_1190);
  local_11a0._0_8_ = CONCAT44(fVar60,fVar60) ^ 0x8000000080000000;
  local_11a0._8_4_ = -fVar60;
  local_11a0._12_4_ = -fVar60;
  auVar84 = ZEXT1664(local_11a0);
  iVar9 = (tray->tnear).field_0.i[k];
  local_11b0._4_4_ = iVar9;
  local_11b0._0_4_ = iVar9;
  local_11b0._8_4_ = iVar9;
  local_11b0._12_4_ = iVar9;
  auVar86 = ZEXT1664(local_11b0);
  iVar9 = 1 << ((uint)k & 0x1f);
  auVar38._4_4_ = iVar9;
  auVar38._0_4_ = iVar9;
  auVar38._8_4_ = iVar9;
  auVar38._12_4_ = iVar9;
  auVar38._16_4_ = iVar9;
  auVar38._20_4_ = iVar9;
  auVar38._24_4_ = iVar9;
  auVar38._28_4_ = iVar9;
  auVar52 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar38 = vpand_avx2(auVar38,auVar52);
  local_10e0 = vpcmpeqd_avx2(auVar38,auVar52);
  local_1300 = k;
  uVar14 = local_1308;
  uVar19 = local_1318;
  uVar21 = local_1320;
  uVar22 = local_1310;
  do {
    do {
      do {
        if (local_1390 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar8 = local_1390 + -1;
        local_1390 = local_1390 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar8 + 8));
      uVar29 = *(ulong *)*local_1390;
      do {
        if ((uVar29 & 8) == 0) {
          uVar11 = uVar29 & 0xfffffffffffffff0;
          uVar10 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar40._4_4_ = uVar10;
          auVar40._0_4_ = uVar10;
          auVar40._8_4_ = uVar10;
          auVar40._12_4_ = uVar10;
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar14),auVar40,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar14));
          auVar41 = vfmadd213ps_fma(auVar41,auVar69._0_16_,auVar79._0_16_);
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar22),auVar40,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar22));
          auVar47 = vfmadd213ps_fma(auVar47,auVar72._0_16_,auVar81._0_16_);
          auVar41 = vpmaxsd_avx(auVar41,auVar47);
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar19),auVar40,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar19));
          auVar47 = vfmadd213ps_fma(auVar47,auVar73._0_16_,auVar84._0_16_);
          auVar47 = vpmaxsd_avx(auVar47,auVar86._0_16_);
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar21),auVar40,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar21));
          local_10c0[0] = vpmaxsd_avx(auVar41,auVar47);
          auVar41 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar18),auVar40,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar18));
          auVar47 = vfmadd213ps_fma(auVar54,auVar69._0_16_,auVar79._0_16_);
          auVar41 = vfmadd213ps_fma(auVar41,auVar72._0_16_,auVar81._0_16_);
          auVar41 = vpminsd_avx(auVar47,auVar41);
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar23),auVar40,
                                    *(undefined1 (*) [16])(uVar11 + 0x20 + uVar23));
          auVar47 = vfmadd213ps_fma(auVar47,auVar73._0_16_,auVar84._0_16_);
          auVar47 = vpminsd_avx(auVar47,auVar39._0_16_);
          auVar41 = vpminsd_avx(auVar41,auVar47);
          if (((uint)uVar29 & 7) == 6) {
            auVar47 = vcmpps_avx(local_10c0[0],auVar41,2);
            auVar41 = vcmpps_avx(*(undefined1 (*) [16])(uVar11 + 0xe0),auVar40,2);
            auVar54 = vcmpps_avx(auVar40,*(undefined1 (*) [16])(uVar11 + 0xf0),1);
            auVar41 = vandps_avx(auVar41,auVar54);
            auVar41 = vandps_avx(auVar41,auVar47);
          }
          else {
            auVar41 = vcmpps_avx(local_10c0[0],auVar41,2);
          }
          auVar41 = vpslld_avx(auVar41,0x1f);
          uVar16 = vmovmskps_avx(auVar41);
          local_1300 = (size_t)uVar16;
        }
        if ((uVar29 & 8) == 0) {
          if (local_1300 == 0) {
            iVar9 = 4;
          }
          else {
            uVar11 = uVar29 & 0xfffffffffffffff0;
            lVar6 = 0;
            for (uVar29 = local_1300; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000)
            {
              lVar6 = lVar6 + 1;
            }
            iVar9 = 0;
            uVar20 = local_1300 - 1 & local_1300;
            uVar29 = *(ulong *)(uVar11 + lVar6 * 8);
            if (uVar20 != 0) {
              uVar16 = *(uint *)(local_10c0[0] + lVar6 * 4);
              lVar6 = 0;
              for (uVar24 = uVar20; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                lVar6 = lVar6 + 1;
              }
              uVar20 = uVar20 - 1 & uVar20;
              uVar24 = *(ulong *)(uVar11 + lVar6 * 8);
              uVar74 = *(uint *)(local_10c0[0] + lVar6 * 4);
              if (uVar20 == 0) {
                if (uVar16 < uVar74) {
                  *(ulong *)*local_1390 = uVar24;
                  *(uint *)(*local_1390 + 8) = uVar74;
                  local_1390 = local_1390 + 1;
                }
                else {
                  *(ulong *)*local_1390 = uVar29;
                  *(uint *)(*local_1390 + 8) = uVar16;
                  uVar29 = uVar24;
                  local_1390 = local_1390 + 1;
                }
              }
              else {
                auVar41._8_8_ = 0;
                auVar41._0_8_ = uVar29;
                auVar41 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar16));
                auVar47._8_8_ = 0;
                auVar47._0_8_ = uVar24;
                auVar47 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar74));
                lVar6 = 0;
                for (uVar29 = uVar20; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000)
                {
                  lVar6 = lVar6 + 1;
                }
                uVar20 = uVar20 - 1 & uVar20;
                auVar54._8_8_ = 0;
                auVar54._0_8_ = *(ulong *)(uVar11 + lVar6 * 8);
                auVar40 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_10c0[0] + lVar6 * 4)));
                auVar54 = vpcmpgtd_avx(auVar47,auVar41);
                if (uVar20 == 0) {
                  auVar64 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar47,auVar41,auVar64);
                  auVar41 = vblendvps_avx(auVar41,auVar47,auVar64);
                  auVar47 = vpcmpgtd_avx(auVar40,auVar54);
                  auVar64 = vpshufd_avx(auVar47,0xaa);
                  auVar47 = vblendvps_avx(auVar40,auVar54,auVar64);
                  auVar54 = vblendvps_avx(auVar54,auVar40,auVar64);
                  auVar40 = vpcmpgtd_avx(auVar54,auVar41);
                  auVar64 = vpshufd_avx(auVar40,0xaa);
                  auVar40 = vblendvps_avx(auVar54,auVar41,auVar64);
                  auVar41 = vblendvps_avx(auVar41,auVar54,auVar64);
                  *local_1390 = auVar41;
                  local_1390[1] = auVar40;
                  uVar29 = auVar47._0_8_;
                  local_1390 = local_1390 + 2;
                }
                else {
                  lVar6 = 0;
                  for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
                    lVar6 = lVar6 + 1;
                  }
                  auVar64._8_8_ = 0;
                  auVar64._0_8_ = *(ulong *)(uVar11 + lVar6 * 8);
                  auVar34 = vpunpcklqdq_avx(auVar64,ZEXT416(*(uint *)(local_10c0[0] + lVar6 * 4)));
                  auVar64 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar47,auVar41,auVar64);
                  auVar41 = vblendvps_avx(auVar41,auVar47,auVar64);
                  auVar47 = vpcmpgtd_avx(auVar34,auVar40);
                  auVar64 = vpshufd_avx(auVar47,0xaa);
                  auVar47 = vblendvps_avx(auVar34,auVar40,auVar64);
                  auVar40 = vblendvps_avx(auVar40,auVar34,auVar64);
                  auVar64 = vpcmpgtd_avx(auVar40,auVar41);
                  auVar34 = vpshufd_avx(auVar64,0xaa);
                  auVar64 = vblendvps_avx(auVar40,auVar41,auVar34);
                  auVar41 = vblendvps_avx(auVar41,auVar40,auVar34);
                  auVar40 = vpcmpgtd_avx(auVar47,auVar54);
                  auVar34 = vpshufd_avx(auVar40,0xaa);
                  auVar40 = vblendvps_avx(auVar47,auVar54,auVar34);
                  auVar47 = vblendvps_avx(auVar54,auVar47,auVar34);
                  auVar54 = vpcmpgtd_avx(auVar64,auVar47);
                  auVar34 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar64,auVar47,auVar34);
                  auVar47 = vblendvps_avx(auVar47,auVar64,auVar34);
                  *local_1390 = auVar41;
                  local_1390[1] = auVar47;
                  local_1390[2] = auVar54;
                  uVar29 = auVar40._0_8_;
                  local_1390 = local_1390 + 3;
                }
              }
            }
          }
        }
        else {
          iVar9 = 6;
        }
      } while (iVar9 == 0);
    } while (iVar9 != 6);
    local_12f0 = (RayHitK<8> *)((ulong)((uint)uVar29 & 0xf) - 8);
    if (local_12f0 != (RayHitK<8> *)0x0) {
      uVar29 = uVar29 & 0xfffffffffffffff0;
      pRVar13 = (RayHitK<8> *)0x0;
      do {
        lVar12 = (long)pRVar13 * 0x50;
        pSVar3 = context->scene;
        pGVar4 = (pSVar3->geometries).items[*(uint *)(uVar29 + 0x30 + lVar12)].ptr;
        fVar53 = (pGVar4->time_range).lower;
        fVar53 = pGVar4->fnumTimeSegments *
                 ((*(float *)(ray + k * 4 + 0xe0) - fVar53) / ((pGVar4->time_range).upper - fVar53))
        ;
        auVar41 = vroundss_avx(ZEXT416((uint)fVar53),ZEXT416((uint)fVar53),9);
        auVar41 = vminss_avx(auVar41,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
        auVar42 = vmaxss_avx(ZEXT816(0),auVar41);
        lVar17 = (long)(int)auVar42._0_4_ * 0x38;
        uVar19 = (ulong)*(uint *)(uVar29 + 4 + lVar12);
        lVar6 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar17);
        lVar17 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar17);
        auVar41 = *(undefined1 (*) [16])(lVar6 + (ulong)*(uint *)(uVar29 + lVar12) * 4);
        uVar14 = (ulong)*(uint *)(uVar29 + 0x10 + lVar12);
        auVar47 = *(undefined1 (*) [16])(lVar6 + uVar14 * 4);
        uVar21 = (ulong)*(uint *)(uVar29 + 0x20 + lVar12);
        auVar49 = *(undefined1 (*) [16])(lVar6 + uVar21 * 4);
        auVar54 = *(undefined1 (*) [16])(lVar6 + uVar19 * 4);
        uVar22 = (ulong)*(uint *)(uVar29 + 0x14 + lVar12);
        auVar40 = *(undefined1 (*) [16])(lVar6 + uVar22 * 4);
        uVar11 = (ulong)*(uint *)(uVar29 + 0x24 + lVar12);
        auVar55 = *(undefined1 (*) [16])(lVar6 + uVar11 * 4);
        uVar27 = (ulong)*(uint *)(uVar29 + 8 + lVar12);
        auVar64 = *(undefined1 (*) [16])(lVar6 + uVar27 * 4);
        uVar25 = (ulong)*(uint *)(uVar29 + 0x18 + lVar12);
        auVar34 = *(undefined1 (*) [16])(lVar6 + uVar25 * 4);
        uVar20 = (ulong)*(uint *)(uVar29 + 0x28 + lVar12);
        auVar30 = *(undefined1 (*) [16])(lVar6 + uVar20 * 4);
        uVar28 = (ulong)*(uint *)(uVar29 + 0xc + lVar12);
        auVar36 = *(undefined1 (*) [16])(lVar6 + uVar28 * 4);
        uVar26 = (ulong)*(uint *)(uVar29 + 0x1c + lVar12);
        auVar31 = *(undefined1 (*) [16])(lVar6 + uVar26 * 4);
        uVar24 = (ulong)*(uint *)(uVar29 + 0x2c + lVar12);
        auVar32 = *(undefined1 (*) [16])(lVar6 + uVar24 * 4);
        auVar33 = *(undefined1 (*) [16])(lVar17 + (ulong)*(uint *)(uVar29 + lVar12) * 4);
        auVar43 = *(undefined1 (*) [16])(lVar17 + uVar14 * 4);
        fVar53 = fVar53 - auVar42._0_4_;
        auVar42 = vunpcklps_avx(auVar41,auVar64);
        auVar64 = vunpckhps_avx(auVar41,auVar64);
        auVar48 = vunpcklps_avx(auVar54,auVar36);
        auVar54 = vunpckhps_avx(auVar54,auVar36);
        auVar41 = *(undefined1 (*) [16])(lVar17 + uVar19 * 4);
        local_1120 = vunpcklps_avx(auVar64,auVar54);
        auVar36 = vunpcklps_avx(auVar42,auVar48);
        auVar64 = vunpckhps_avx(auVar42,auVar48);
        auVar42 = vunpcklps_avx(auVar47,auVar34);
        auVar54 = vunpckhps_avx(auVar47,auVar34);
        auVar34 = vunpcklps_avx(auVar40,auVar31);
        auVar40 = vunpckhps_avx(auVar40,auVar31);
        auVar47 = *(undefined1 (*) [16])(lVar17 + uVar27 * 4);
        local_1110 = vunpcklps_avx(auVar54,auVar40);
        auVar31 = vunpcklps_avx(auVar42,auVar34);
        local_1130 = vunpckhps_avx(auVar42,auVar34);
        auVar42 = vunpcklps_avx(auVar49,auVar30);
        auVar40 = vunpckhps_avx(auVar49,auVar30);
        auVar30 = vunpcklps_avx(auVar55,auVar32);
        auVar34 = vunpckhps_avx(auVar55,auVar32);
        auVar54 = *(undefined1 (*) [16])(lVar17 + uVar28 * 4);
        local_1330 = vunpcklps_avx(auVar40,auVar34);
        local_1340 = vunpcklps_avx(auVar42,auVar30);
        local_1100 = vunpckhps_avx(auVar42,auVar30);
        auVar40 = vunpcklps_avx(auVar33,auVar47);
        auVar47 = vunpckhps_avx(auVar33,auVar47);
        auVar34 = vunpcklps_avx(auVar41,auVar54);
        auVar54 = vunpckhps_avx(auVar41,auVar54);
        auVar41 = *(undefined1 (*) [16])(lVar17 + uVar25 * 4);
        auVar30 = vunpcklps_avx(auVar47,auVar54);
        auVar32 = vunpcklps_avx(auVar40,auVar34);
        auVar54 = vunpckhps_avx(auVar40,auVar34);
        auVar34 = vunpcklps_avx(auVar43,auVar41);
        auVar40 = vunpckhps_avx(auVar43,auVar41);
        auVar41 = *(undefined1 (*) [16])(lVar17 + uVar22 * 4);
        auVar47 = *(undefined1 (*) [16])(lVar17 + uVar26 * 4);
        auVar33 = vunpcklps_avx(auVar41,auVar47);
        auVar41 = vunpckhps_avx(auVar41,auVar47);
        auVar43 = vunpcklps_avx(auVar40,auVar41);
        auVar42 = vunpcklps_avx(auVar34,auVar33);
        auVar40 = vunpckhps_avx(auVar34,auVar33);
        auVar41 = *(undefined1 (*) [16])(lVar17 + uVar21 * 4);
        auVar47 = *(undefined1 (*) [16])(lVar17 + uVar20 * 4);
        auVar33 = vunpcklps_avx(auVar41,auVar47);
        auVar34 = vunpckhps_avx(auVar41,auVar47);
        auVar41 = *(undefined1 (*) [16])(lVar17 + uVar11 * 4);
        auVar47 = *(undefined1 (*) [16])(lVar17 + uVar24 * 4);
        auVar48 = vunpcklps_avx(auVar41,auVar47);
        auVar41 = vunpckhps_avx(auVar41,auVar47);
        auVar47 = vunpcklps_avx(auVar34,auVar41);
        auVar34 = vunpcklps_avx(auVar33,auVar48);
        auVar41 = vunpckhps_avx(auVar33,auVar48);
        fVar59 = 1.0 - fVar53;
        auVar82._4_4_ = fVar59;
        auVar82._0_4_ = fVar59;
        auVar82._8_4_ = fVar59;
        auVar82._12_4_ = fVar59;
        auVar65._0_4_ = fVar53 * auVar32._0_4_;
        auVar65._4_4_ = fVar53 * auVar32._4_4_;
        auVar65._8_4_ = fVar53 * auVar32._8_4_;
        auVar65._12_4_ = fVar53 * auVar32._12_4_;
        auVar36 = vfmadd231ps_fma(auVar65,auVar82,auVar36);
        auVar66._0_4_ = fVar53 * auVar54._0_4_;
        auVar66._4_4_ = fVar53 * auVar54._4_4_;
        auVar66._8_4_ = fVar53 * auVar54._8_4_;
        auVar66._12_4_ = fVar53 * auVar54._12_4_;
        auVar32 = vfmadd231ps_fma(auVar66,auVar82,auVar64);
        auVar70._0_4_ = fVar53 * auVar30._0_4_;
        auVar70._4_4_ = fVar53 * auVar30._4_4_;
        auVar70._8_4_ = fVar53 * auVar30._8_4_;
        auVar70._12_4_ = fVar53 * auVar30._12_4_;
        auVar33 = vfmadd231ps_fma(auVar70,auVar82,local_1120);
        auVar30._0_4_ = fVar53 * auVar42._0_4_;
        auVar30._4_4_ = fVar53 * auVar42._4_4_;
        auVar30._8_4_ = fVar53 * auVar42._8_4_;
        auVar30._12_4_ = fVar53 * auVar42._12_4_;
        auVar54 = vfmadd231ps_fma(auVar30,auVar82,auVar31);
        auVar42._0_4_ = fVar53 * auVar40._0_4_;
        auVar42._4_4_ = fVar53 * auVar40._4_4_;
        auVar42._8_4_ = fVar53 * auVar40._8_4_;
        auVar42._12_4_ = fVar53 * auVar40._12_4_;
        auVar40 = vfmadd231ps_fma(auVar42,auVar82,local_1130);
        auVar48._0_4_ = fVar53 * auVar43._0_4_;
        auVar48._4_4_ = fVar53 * auVar43._4_4_;
        auVar48._8_4_ = fVar53 * auVar43._8_4_;
        auVar48._12_4_ = fVar53 * auVar43._12_4_;
        auVar64 = vfmadd231ps_fma(auVar48,auVar82,local_1110);
        puVar1 = (undefined8 *)(uVar29 + 0x30 + lVar12);
        local_10f0 = *puVar1;
        uStack_10e8 = puVar1[1];
        puVar1 = (undefined8 *)(uVar29 + 0x40 + lVar12);
        auVar62._0_4_ = fVar53 * auVar34._0_4_;
        auVar62._4_4_ = fVar53 * auVar34._4_4_;
        auVar62._8_4_ = fVar53 * auVar34._8_4_;
        auVar62._12_4_ = fVar53 * auVar34._12_4_;
        auVar77._0_4_ = fVar53 * auVar41._0_4_;
        auVar77._4_4_ = fVar53 * auVar41._4_4_;
        auVar77._8_4_ = fVar53 * auVar41._8_4_;
        auVar77._12_4_ = fVar53 * auVar41._12_4_;
        auVar85._0_4_ = fVar53 * auVar47._0_4_;
        auVar85._4_4_ = fVar53 * auVar47._4_4_;
        auVar85._8_4_ = fVar53 * auVar47._8_4_;
        auVar85._12_4_ = fVar53 * auVar47._12_4_;
        auVar34 = vfmadd231ps_fma(auVar62,auVar82,local_1340);
        auVar30 = vfmadd231ps_fma(auVar77,auVar82,local_1100);
        auVar31 = vfmadd231ps_fma(auVar85,auVar82,local_1330);
        local_12b0 = *puVar1;
        uStack_12a8 = puVar1[1];
        auVar47 = vsubps_avx(auVar36,auVar54);
        auVar41 = vsubps_avx(auVar32,auVar40);
        auVar54 = vsubps_avx(auVar33,auVar64);
        auVar40 = vsubps_avx(auVar34,auVar36);
        auVar64 = vsubps_avx(auVar30,auVar32);
        auVar34 = vsubps_avx(auVar31,auVar33);
        auVar43._0_4_ = auVar41._0_4_ * auVar34._0_4_;
        auVar43._4_4_ = auVar41._4_4_ * auVar34._4_4_;
        auVar43._8_4_ = auVar41._8_4_ * auVar34._8_4_;
        auVar43._12_4_ = auVar41._12_4_ * auVar34._12_4_;
        local_1210 = vfmsub231ps_fma(auVar43,auVar64,auVar54);
        auVar55._0_4_ = auVar54._0_4_ * auVar40._0_4_;
        auVar55._4_4_ = auVar54._4_4_ * auVar40._4_4_;
        auVar55._8_4_ = auVar54._8_4_ * auVar40._8_4_;
        auVar55._12_4_ = auVar54._12_4_ * auVar40._12_4_;
        local_1200 = vfmsub231ps_fma(auVar55,auVar34,auVar47);
        uVar10 = *(undefined4 *)(ray + k * 4);
        auVar49._4_4_ = uVar10;
        auVar49._0_4_ = uVar10;
        auVar49._8_4_ = uVar10;
        auVar49._12_4_ = uVar10;
        uVar10 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar63._4_4_ = uVar10;
        auVar63._0_4_ = uVar10;
        auVar63._8_4_ = uVar10;
        auVar63._12_4_ = uVar10;
        uVar10 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar31._4_4_ = uVar10;
        auVar31._0_4_ = uVar10;
        auVar31._8_4_ = uVar10;
        auVar31._12_4_ = uVar10;
        fVar53 = *(float *)(ray + k * 4 + 0x80);
        auVar83._4_4_ = fVar53;
        auVar83._0_4_ = fVar53;
        auVar83._8_4_ = fVar53;
        auVar83._12_4_ = fVar53;
        auVar30 = vsubps_avx(auVar36,auVar49);
        fVar59 = *(float *)(ray + k * 4 + 0xa0);
        auVar87._4_4_ = fVar59;
        auVar87._0_4_ = fVar59;
        auVar87._8_4_ = fVar59;
        auVar87._12_4_ = fVar59;
        auVar36 = vsubps_avx(auVar32,auVar63);
        fVar60 = *(float *)(ray + k * 4 + 0xc0);
        auVar88._4_4_ = fVar60;
        auVar88._0_4_ = fVar60;
        auVar88._8_4_ = fVar60;
        auVar88._12_4_ = fVar60;
        auVar31 = vsubps_avx(auVar33,auVar31);
        auVar32._0_4_ = fVar53 * auVar36._0_4_;
        auVar32._4_4_ = fVar53 * auVar36._4_4_;
        auVar32._8_4_ = fVar53 * auVar36._8_4_;
        auVar32._12_4_ = fVar53 * auVar36._12_4_;
        auVar32 = vfmsub231ps_fma(auVar32,auVar30,auVar87);
        auVar71._0_4_ = auVar34._0_4_ * auVar32._0_4_;
        auVar71._4_4_ = auVar34._4_4_ * auVar32._4_4_;
        auVar71._8_4_ = auVar34._8_4_ * auVar32._8_4_;
        auVar71._12_4_ = auVar34._12_4_ * auVar32._12_4_;
        auVar33._0_4_ = auVar54._0_4_ * auVar32._0_4_;
        auVar33._4_4_ = auVar54._4_4_ * auVar32._4_4_;
        auVar33._8_4_ = auVar54._8_4_ * auVar32._8_4_;
        auVar33._12_4_ = auVar54._12_4_ * auVar32._12_4_;
        auVar67._0_4_ = fVar60 * auVar30._0_4_;
        auVar67._4_4_ = fVar60 * auVar30._4_4_;
        auVar67._8_4_ = fVar60 * auVar30._8_4_;
        auVar67._12_4_ = fVar60 * auVar30._12_4_;
        auVar34 = vfmsub231ps_fma(auVar67,auVar31,auVar83);
        auVar54 = vfmadd231ps_fma(auVar71,auVar34,auVar64);
        auVar34 = vfmadd231ps_fma(auVar33,auVar41,auVar34);
        auVar68._0_4_ = auVar64._0_4_ * auVar47._0_4_;
        auVar68._4_4_ = auVar64._4_4_ * auVar47._4_4_;
        auVar68._8_4_ = auVar64._8_4_ * auVar47._8_4_;
        auVar68._12_4_ = auVar64._12_4_ * auVar47._12_4_;
        local_11f0 = vfmsub231ps_fma(auVar68,auVar40,auVar41);
        auVar78._0_4_ = fVar59 * auVar31._0_4_;
        auVar78._4_4_ = fVar59 * auVar31._4_4_;
        auVar78._8_4_ = fVar59 * auVar31._8_4_;
        auVar78._12_4_ = fVar59 * auVar31._12_4_;
        auVar32 = vfmsub231ps_fma(auVar78,auVar36,auVar88);
        auVar80._0_4_ = fVar60 * local_11f0._0_4_;
        auVar80._4_4_ = fVar60 * local_11f0._4_4_;
        auVar80._8_4_ = fVar60 * local_11f0._8_4_;
        auVar80._12_4_ = fVar60 * local_11f0._12_4_;
        auVar41 = vfmadd231ps_fma(auVar80,local_1200,auVar87);
        auVar64 = vfmadd231ps_fma(auVar41,local_1210,auVar83);
        auVar54 = vfmadd231ps_fma(auVar54,auVar32,auVar40);
        auVar41 = vandps_avx(auVar64,local_1140);
        uVar16 = auVar41._0_4_;
        local_12a0._0_4_ = (float)(uVar16 ^ auVar54._0_4_);
        uVar74 = auVar41._4_4_;
        local_12a0._4_4_ = (float)(uVar74 ^ auVar54._4_4_);
        uVar75 = auVar41._8_4_;
        local_12a0._8_4_ = (float)(uVar75 ^ auVar54._8_4_);
        uVar76 = auVar41._12_4_;
        local_12a0._12_4_ = (float)(uVar76 ^ auVar54._12_4_);
        auVar41 = vfmadd231ps_fma(auVar34,auVar47,auVar32);
        local_1290._0_4_ = (float)(uVar16 ^ auVar41._0_4_);
        local_1290._4_4_ = (float)(uVar74 ^ auVar41._4_4_);
        local_1290._8_4_ = (float)(uVar75 ^ auVar41._8_4_);
        local_1290._12_4_ = (float)(uVar76 ^ auVar41._12_4_);
        auVar54 = ZEXT816(0) << 0x20;
        auVar41 = vcmpps_avx(local_12a0,auVar54,5);
        auVar47 = vcmpps_avx(local_1290,auVar54,5);
        auVar41 = vandps_avx(auVar41,auVar47);
        auVar56._8_4_ = 0x7fffffff;
        auVar56._0_8_ = 0x7fffffff7fffffff;
        auVar56._12_4_ = 0x7fffffff;
        local_1270 = vandps_avx(auVar64,auVar56);
        auVar47 = vcmpps_avx(auVar64,auVar54,4);
        auVar41 = vandps_avx(auVar47,auVar41);
        auVar34._0_4_ = local_1290._0_4_ + local_12a0._0_4_;
        auVar34._4_4_ = local_1290._4_4_ + local_12a0._4_4_;
        auVar34._8_4_ = local_1290._8_4_ + local_12a0._8_4_;
        auVar34._12_4_ = local_1290._12_4_ + local_12a0._12_4_;
        auVar47 = vcmpps_avx(auVar34,local_1270,2);
        auVar54 = auVar47 & auVar41;
        if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar54[0xf] < '\0') {
          auVar41 = vandps_avx(auVar41,auVar47);
          auVar35._0_4_ = local_11f0._0_4_ * auVar31._0_4_;
          auVar35._4_4_ = local_11f0._4_4_ * auVar31._4_4_;
          auVar35._8_4_ = local_11f0._8_4_ * auVar31._8_4_;
          auVar35._12_4_ = local_11f0._12_4_ * auVar31._12_4_;
          auVar47 = vfmadd213ps_fma(auVar36,local_1200,auVar35);
          auVar47 = vfmadd213ps_fma(auVar30,local_1210,auVar47);
          local_1280._0_4_ = (float)(uVar16 ^ auVar47._0_4_);
          local_1280._4_4_ = (float)(uVar74 ^ auVar47._4_4_);
          local_1280._8_4_ = (float)(uVar75 ^ auVar47._8_4_);
          local_1280._12_4_ = (float)(uVar76 ^ auVar47._12_4_);
          fVar53 = *(float *)(ray + k * 4 + 0x60);
          auVar36._0_4_ = local_1270._0_4_ * fVar53;
          auVar36._4_4_ = local_1270._4_4_ * fVar53;
          auVar36._8_4_ = local_1270._8_4_ * fVar53;
          auVar36._12_4_ = local_1270._12_4_ * fVar53;
          auVar47 = vcmpps_avx(auVar36,local_1280,1);
          fVar53 = *(float *)(ray + k * 4 + 0x100);
          auVar50._0_4_ = local_1270._0_4_ * fVar53;
          auVar50._4_4_ = local_1270._4_4_ * fVar53;
          auVar50._8_4_ = local_1270._8_4_ * fVar53;
          auVar50._12_4_ = local_1270._12_4_ * fVar53;
          auVar54 = vcmpps_avx(local_1280,auVar50,2);
          auVar47 = vandps_avx(auVar47,auVar54);
          auVar54 = auVar41 & auVar47;
          if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar54[0xf] < '\0') {
            local_1350 = vandps_avx(auVar41,auVar47);
            local_1250 = local_1350;
            auVar41 = vrcpps_avx(local_1270);
            auVar44._8_4_ = 0x3f800000;
            auVar44._0_8_ = &DAT_3f8000003f800000;
            auVar44._12_4_ = 0x3f800000;
            auVar47 = vfnmadd213ps_fma(local_1270,auVar41,auVar44);
            auVar41 = vfmadd132ps_fma(auVar47,auVar41,auVar41);
            fVar53 = auVar41._0_4_;
            local_1220._0_4_ = fVar53 * local_1280._0_4_;
            fVar59 = auVar41._4_4_;
            local_1220._4_4_ = fVar59 * local_1280._4_4_;
            fVar60 = auVar41._8_4_;
            local_1220._8_4_ = fVar60 * local_1280._8_4_;
            fVar61 = auVar41._12_4_;
            local_1220._12_4_ = fVar61 * local_1280._12_4_;
            auVar39 = ZEXT1664(local_1220);
            local_1240[0] = fVar53 * local_12a0._0_4_;
            local_1240[1] = fVar59 * local_12a0._4_4_;
            local_1240[2] = fVar60 * local_12a0._8_4_;
            local_1240[3] = fVar61 * local_12a0._12_4_;
            auVar45._8_4_ = 0x7f800000;
            auVar45._0_8_ = 0x7f8000007f800000;
            auVar45._12_4_ = 0x7f800000;
            auVar41 = vblendvps_avx(auVar45,local_1220,local_1350);
            local_1230[0] = fVar53 * local_1290._0_4_;
            local_1230[1] = fVar59 * local_1290._4_4_;
            local_1230[2] = fVar60 * local_1290._8_4_;
            local_1230[3] = fVar61 * local_1290._12_4_;
            auVar47 = vshufps_avx(auVar41,auVar41,0xb1);
            auVar47 = vminps_avx(auVar47,auVar41);
            auVar54 = vshufpd_avx(auVar47,auVar47,1);
            auVar47 = vminps_avx(auVar54,auVar47);
            auVar47 = vcmpps_avx(auVar41,auVar47,0);
            auVar54 = local_1350 & auVar47;
            auVar41 = vpcmpeqd_avx(auVar41,auVar41);
            if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar54[0xf] < '\0') {
              auVar41 = auVar47;
            }
            auVar41 = vandps_avx(local_1350,auVar41);
            pRVar15 = pRVar13;
            local_12f8 = pSVar3;
            local_12e8 = pRVar13;
            do {
              auVar41 = vpslld_avx(auVar41,0x1f);
              uVar10 = vmovmskps_avx(auVar41);
              lVar6 = 0;
              for (uVar14 = CONCAT44((int)((ulong)pRVar15 >> 0x20),uVar10); (uVar14 & 1) == 0;
                  uVar14 = uVar14 >> 1 | 0x8000000000000000) {
                lVar6 = lVar6 + 1;
              }
              uVar16 = *(uint *)((long)&local_10f0 + lVar6 * 4);
              pRVar15 = (RayHitK<8> *)(ulong)uVar16;
              pGVar4 = (pSVar3->geometries).items[(long)pRVar15].ptr;
              if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                *(undefined4 *)(local_1350 + lVar6 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  uVar14 = (ulong)(uint)((int)lVar6 << 2);
                  uVar10 = *(undefined4 *)((long)local_1240 + uVar14);
                  uVar2 = *(undefined4 *)((long)local_1230 + uVar14);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1220 + uVar14);
                  *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1210 + uVar14);
                  *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1200 + uVar14);
                  *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11f0 + uVar14);
                  *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar10;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                  *(undefined4 *)(ray + k * 4 + 0x220) = *(undefined4 *)((long)&local_12b0 + uVar14)
                  ;
                  *(uint *)(ray + k * 4 + 0x240) = uVar16;
                  *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  break;
                }
                auVar41 = auVar39._0_16_;
                uVar14 = (ulong)(uint)((int)lVar6 * 4);
                uVar10 = *(undefined4 *)((long)local_1240 + uVar14);
                local_1060._4_4_ = uVar10;
                local_1060._0_4_ = uVar10;
                local_1060._8_4_ = uVar10;
                local_1060._12_4_ = uVar10;
                local_1060._16_4_ = uVar10;
                local_1060._20_4_ = uVar10;
                local_1060._24_4_ = uVar10;
                local_1060._28_4_ = uVar10;
                local_1040 = *(undefined4 *)((long)local_1230 + uVar14);
                uVar10 = *(undefined4 *)((long)&local_12b0 + uVar14);
                auVar57._4_4_ = uVar10;
                auVar57._0_4_ = uVar10;
                auVar57._8_4_ = uVar10;
                auVar57._12_4_ = uVar10;
                auVar58._16_4_ = uVar10;
                auVar58._0_16_ = auVar57;
                auVar58._20_4_ = uVar10;
                auVar58._24_4_ = uVar10;
                auVar58._28_4_ = uVar10;
                local_10c0[0]._4_4_ = *(undefined4 *)(local_1210 + uVar14);
                uVar10 = *(undefined4 *)(local_1200 + uVar14);
                local_10a0._4_4_ = uVar10;
                local_10a0._0_4_ = uVar10;
                local_10a0._8_4_ = uVar10;
                local_10a0._12_4_ = uVar10;
                local_10a0._16_4_ = uVar10;
                local_10a0._20_4_ = uVar10;
                local_10a0._24_4_ = uVar10;
                local_10a0._28_4_ = uVar10;
                uVar10 = *(undefined4 *)(local_11f0 + uVar14);
                local_1080._4_4_ = uVar10;
                local_1080._0_4_ = uVar10;
                local_1080._8_4_ = uVar10;
                local_1080._12_4_ = uVar10;
                local_1080._16_4_ = uVar10;
                local_1080._20_4_ = uVar10;
                local_1080._24_4_ = uVar10;
                local_1080._28_4_ = uVar10;
                auVar51._4_4_ = uVar16;
                auVar51._0_4_ = uVar16;
                auVar51._8_4_ = uVar16;
                auVar51._12_4_ = uVar16;
                auVar52._16_4_ = uVar16;
                auVar52._0_16_ = auVar51;
                auVar52._20_4_ = uVar16;
                auVar52._24_4_ = uVar16;
                auVar52._28_4_ = uVar16;
                local_10c0[0]._0_4_ = local_10c0[0]._4_4_;
                local_10c0[0]._8_4_ = local_10c0[0]._4_4_;
                local_10c0[0]._12_4_ = local_10c0[0]._4_4_;
                local_10c0[1]._0_4_ = local_10c0[0]._4_4_;
                local_10c0[1]._4_4_ = local_10c0[0]._4_4_;
                local_10c0[1]._8_4_ = local_10c0[0]._4_4_;
                local_10c0[1]._12_4_ = local_10c0[0]._4_4_;
                uStack_103c = local_1040;
                uStack_1038 = local_1040;
                uStack_1034 = local_1040;
                uStack_1030 = local_1040;
                uStack_102c = local_1040;
                uStack_1028 = local_1040;
                uStack_1024 = local_1040;
                local_1020 = auVar58;
                local_1000 = auVar52;
                vpcmpeqd_avx2(local_1060,local_1060);
                uStack_fdc = context->user->instID[0];
                local_fe0 = uStack_fdc;
                uStack_fd8 = uStack_fdc;
                uStack_fd4 = uStack_fdc;
                uStack_fd0 = uStack_fdc;
                uStack_fcc = uStack_fdc;
                uStack_fc8 = uStack_fdc;
                uStack_fc4 = uStack_fdc;
                uStack_fbc = context->user->instPrimID[0];
                local_fc0 = uStack_fbc;
                uStack_fb8 = uStack_fbc;
                uStack_fb4 = uStack_fbc;
                uStack_fb0 = uStack_fbc;
                uStack_fac = uStack_fbc;
                uStack_fa8 = uStack_fbc;
                uStack_fa4 = uStack_fbc;
                uVar10 = *(undefined4 *)(ray + k * 4 + 0x100);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1220 + uVar14);
                local_11e0 = local_10e0._0_8_;
                uStack_11d8 = local_10e0._8_8_;
                uStack_11d0 = local_10e0._16_8_;
                uStack_11c8 = local_10e0._24_8_;
                local_12e0 = &local_11e0;
                local_12d8 = pGVar4->userPtr;
                local_12d0 = context->user;
                local_12c0 = (undefined1 (*) [32])local_10c0;
                local_12b8 = 8;
                pRVar15 = (RayHitK<8> *)pGVar4->intersectionFilterN;
                local_12c8 = ray;
                if (pRVar15 != (RayHitK<8> *)0x0) {
                  auVar52 = ZEXT1632(auVar51);
                  auVar58 = ZEXT1632(auVar57);
                  pRVar15 = (RayHitK<8> *)(*(code *)pRVar15)(&local_12e0);
                }
                auVar5._8_8_ = uStack_11d8;
                auVar5._0_8_ = local_11e0;
                auVar5._16_8_ = uStack_11d0;
                auVar5._24_8_ = uStack_11c8;
                auVar5 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar5);
                auVar38 = _DAT_0205a980 & ~auVar5;
                if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar38 >> 0x7f,0) == '\0') &&
                      (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar38 >> 0xbf,0) == '\0') &&
                    (auVar38 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar38[0x1f]) {
                  auVar39 = ZEXT3264(auVar5 ^ _DAT_0205a980);
                }
                else {
                  pRVar15 = (RayHitK<8> *)context->args->filter;
                  if ((pRVar15 != (RayHitK<8> *)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar52 = ZEXT1632(auVar52._0_16_);
                    auVar58 = ZEXT1632(auVar58._0_16_);
                    pRVar15 = (RayHitK<8> *)(*(code *)pRVar15)(&local_12e0);
                  }
                  auVar7._8_8_ = uStack_11d8;
                  auVar7._0_8_ = local_11e0;
                  auVar7._16_8_ = uStack_11d0;
                  auVar7._24_8_ = uStack_11c8;
                  auVar5 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar7);
                  auVar38 = vpcmpeqd_avx2(auVar58,auVar58);
                  auVar39 = ZEXT3264(auVar5 ^ auVar38);
                  auVar52 = vpcmpeqd_avx2(auVar52,auVar52);
                  auVar38 = auVar38 & ~auVar5;
                  if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar38 >> 0x7f,0) != '\0') ||
                        (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar38 >> 0xbf,0) != '\0') ||
                      (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar38[0x1f] < '\0') {
                    auVar5 = auVar5 ^ auVar52;
                    auVar38 = vmaskmovps_avx(auVar5,*local_12c0);
                    *(undefined1 (*) [32])(local_12c8 + 0x180) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar5,local_12c0[1]);
                    *(undefined1 (*) [32])(local_12c8 + 0x1a0) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar5,local_12c0[2]);
                    *(undefined1 (*) [32])(local_12c8 + 0x1c0) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar5,local_12c0[3]);
                    *(undefined1 (*) [32])(local_12c8 + 0x1e0) = auVar38;
                    auVar38 = vmaskmovps_avx(auVar5,local_12c0[4]);
                    *(undefined1 (*) [32])(local_12c8 + 0x200) = auVar38;
                    auVar38 = vpmaskmovd_avx2(auVar5,local_12c0[5]);
                    *(undefined1 (*) [32])(local_12c8 + 0x220) = auVar38;
                    auVar38 = vpmaskmovd_avx2(auVar5,local_12c0[6]);
                    *(undefined1 (*) [32])(local_12c8 + 0x240) = auVar38;
                    auVar38 = vpmaskmovd_avx2(auVar5,local_12c0[7]);
                    *(undefined1 (*) [32])(local_12c8 + 0x260) = auVar38;
                    auVar38 = vpmaskmovd_avx2(auVar5,local_12c0[8]);
                    *(undefined1 (*) [32])(local_12c8 + 0x280) = auVar38;
                    pRVar15 = local_12c8;
                  }
                }
                auVar38 = auVar39._0_32_;
                if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar38 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar38 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar38 >> 0x7f,0) == '\0') &&
                      (auVar39 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                     SUB321(auVar38 >> 0xbf,0) == '\0') &&
                    (auVar39 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
                    -1 < auVar39[0x1f]) {
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar10;
                  pRVar15 = ray;
                }
                *(undefined4 *)(local_1350 + lVar6 * 4) = 0;
                uVar10 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar37._4_4_ = uVar10;
                auVar37._0_4_ = uVar10;
                auVar37._8_4_ = uVar10;
                auVar37._12_4_ = uVar10;
                auVar39 = ZEXT1664(auVar41);
                auVar41 = vcmpps_avx(auVar41,auVar37,2);
                local_1350 = vandps_avx(auVar41,local_1350);
              }
              if ((((local_1350 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_1350 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_1350 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_1350[0xf]) break;
              auVar46._8_4_ = 0x7f800000;
              auVar46._0_8_ = 0x7f8000007f800000;
              auVar46._12_4_ = 0x7f800000;
              auVar41 = vblendvps_avx(auVar46,auVar39._0_16_,local_1350);
              auVar47 = vshufps_avx(auVar41,auVar41,0xb1);
              auVar47 = vminps_avx(auVar47,auVar41);
              auVar54 = vshufpd_avx(auVar47,auVar47,1);
              auVar47 = vminps_avx(auVar54,auVar47);
              auVar47 = vcmpps_avx(auVar41,auVar47,0);
              auVar54 = local_1350 & auVar47;
              auVar41 = local_1350;
              if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar54[0xf] < '\0') {
                auVar41 = vandps_avx(auVar47,local_1350);
              }
              auVar41 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar41);
            } while( true );
          }
        }
        pRVar13 = pRVar13 + 1;
      } while (pRVar13 != local_12f0);
    }
    uVar10 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar39 = ZEXT1664(CONCAT412(uVar10,CONCAT48(uVar10,CONCAT44(uVar10,uVar10))));
    auVar69 = ZEXT1664(local_1150);
    auVar72 = ZEXT1664(local_1160);
    auVar73 = ZEXT1664(local_1170);
    auVar79 = ZEXT1664(local_1180);
    auVar81 = ZEXT1664(local_1190);
    auVar84 = ZEXT1664(local_11a0);
    auVar86 = ZEXT1664(local_11b0);
    uVar14 = local_1308;
    uVar19 = local_1318;
    uVar21 = local_1320;
    uVar22 = local_1310;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }